

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O0

SC_Lib * Abc_SclReadFromStr(Vec_Str_t *vOut)

{
  int iVar1;
  int iVar2;
  int local_24;
  SC_Lib *pSStack_20;
  int Pos;
  SC_Lib *p;
  Vec_Str_t *vOut_local;
  
  local_24 = 0;
  p = (SC_Lib *)vOut;
  pSStack_20 = Abc_SclLibAlloc();
  iVar2 = Abc_SclReadLibrary((Vec_Str_t *)p,&local_24,pSStack_20);
  iVar1 = local_24;
  if (iVar2 == 0) {
    vOut_local = (Vec_Str_t *)0x0;
  }
  else {
    iVar2 = Vec_StrSize((Vec_Str_t *)p);
    if (iVar1 != iVar2) {
      __assert_fail("Pos == Vec_StrSize(vOut)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclLibScl.c"
                    ,0x19b,"SC_Lib *Abc_SclReadFromStr(Vec_Str_t *)");
    }
    Abc_SclHashCells(pSStack_20);
    Abc_SclLinkCells(pSStack_20);
    vOut_local = (Vec_Str_t *)pSStack_20;
  }
  return (SC_Lib *)vOut_local;
}

Assistant:

SC_Lib * Abc_SclReadFromStr( Vec_Str_t * vOut )
{
    SC_Lib * p;
    int Pos = 0;
    // read the library
    p = Abc_SclLibAlloc();
    if ( !Abc_SclReadLibrary( vOut, &Pos, p ) )
        return NULL;
    assert( Pos == Vec_StrSize(vOut) );
    // hash gates by name
    Abc_SclHashCells( p );
    Abc_SclLinkCells( p );
    return p;
}